

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_import(__mpz_struct *r,size_t count,int order,size_t size,int endian,size_t nails,void *src
               )

{
  long lVar1;
  mp_size_t mVar2;
  ulong in_RCX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  long in_R9;
  byte *in_stack_00000008;
  size_t j;
  mp_size_t i;
  size_t bytes;
  mp_limb_t limb;
  mp_size_t rn;
  mp_ptr rp;
  ptrdiff_t word_step;
  uchar *p;
  mp_srcptr local_80;
  __mpz_struct *in_stack_ffffffffffffff90;
  ulong uVar3;
  mp_size_t local_68;
  long local_60;
  mp_limb_t local_58;
  long local_40;
  byte *local_38;
  int local_24;
  long local_10;
  
  if (in_R9 != 0) {
    gmp_die((char *)0x9ae503);
  }
  local_24 = in_R8D;
  if (in_R8D == 0) {
    local_24 = gmp_detect_endian();
  }
  local_38 = in_stack_00000008;
  if (in_EDX == local_24) {
    lVar1 = 0;
  }
  else {
    lVar1 = in_RCX << 1;
  }
  local_40 = lVar1;
  if (in_EDX == 1) {
    local_38 = in_stack_00000008 + in_RCX * (in_RSI + -1);
    local_40 = -lVar1;
  }
  if (local_24 == 1) {
    local_38 = local_38 + (in_RCX - 1);
  }
  if ((long)*in_RDI < (long)(in_RCX * in_RSI + 7 >> 3)) {
    local_80 = mpz_realloc(in_stack_ffffffffffffff90,lVar1);
  }
  else {
    local_80 = *(mp_srcptr *)(in_RDI + 2);
  }
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  for (local_10 = in_RSI; local_10 != 0; local_10 = local_10 + -1) {
    for (uVar3 = 0; uVar3 < in_RCX; uVar3 = uVar3 + 1) {
      lVar1 = local_60 + 1;
      local_58 = (ulong)*local_38 << ((byte)(local_60 << 3) & 0x3f) | local_58;
      local_60 = lVar1;
      if (lVar1 == 8) {
        local_80[local_68] = local_58;
        local_60 = 0;
        local_58 = 0;
        local_68 = local_68 + 1;
      }
      local_38 = local_38 + -(long)local_24;
    }
    local_38 = local_38 + local_40;
  }
  if (local_58 == 0) {
    mVar2 = mpn_normalized_size(local_80,local_68);
    local_68._0_4_ = (int)mVar2;
  }
  else {
    local_80[local_68] = local_58;
    local_68._0_4_ = (int)local_68 + 1;
  }
  in_RDI[1] = (int)local_68;
  return;
}

Assistant:

void
mpz_import (mpz_t r, size_t count, int order, size_t size, int endian,
	    size_t nails, const void *src)
{
  const unsigned char *p;
  ptrdiff_t word_step;
  mp_ptr rp;
  mp_size_t rn;

  /* The current (partial) limb. */
  mp_limb_t limb;
  /* The number of bytes already copied to this limb (starting from
     the low end). */
  size_t bytes;
  /* The index where the limb should be stored, when completed. */
  mp_size_t i;

  if (nails != 0)
    gmp_die ("mpz_import: Nails not supported.");

  assert (order == 1 || order == -1);
  assert (endian >= -1 && endian <= 1);

  if (endian == 0)
    endian = gmp_detect_endian ();

  p = (unsigned char *) src;

  word_step = (order != endian) ? 2 * size : 0;

  /* Process bytes from the least significant end, so point p at the
     least significant word. */
  if (order == 1)
    {
      p += size * (count - 1);
      word_step = - word_step;
    }

  /* And at least significant byte of that word. */
  if (endian == 1)
    p += (size - 1);

  rn = (size * count + sizeof(mp_limb_t) - 1) / sizeof(mp_limb_t);
  rp = MPZ_REALLOC (r, rn);

  for (limb = 0, bytes = 0, i = 0; count > 0; count--, p += word_step)
    {
      size_t j;
      for (j = 0; j < size; j++, p -= (ptrdiff_t) endian)
	{
	  limb |= (mp_limb_t) *p << (bytes++ * CHAR_BIT);
	  if (bytes == sizeof(mp_limb_t))
	    {
	      rp[i++] = limb;
	      bytes = 0;
	      limb = 0;
	    }
	}
    }
  assert (i + (bytes > 0) == rn);
  if (limb != 0)
    rp[i++] = limb;
  else
    i = mpn_normalized_size (rp, i);

  r->_mp_size = i;
}